

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O2

void capnp::writePackedMessage
               (OutputStream *output,ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  Maybe<kj::BufferedOutputStream_&> this;
  size_t in_RCX;
  size_t sVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<unsigned_char> buffer_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  BufferedOutputStreamWrapper bufferedOutput;
  byte buffer [8192];
  BufferedOutputStreamWrapper local_2070;
  uchar local_2028 [8200];
  
  segments_00.ptr = (ArrayPtr<const_capnp::word> *)segments.size_;
  this = kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream,kj::OutputStream>(output);
  if (this.ptr != (BufferedOutputStream *)0x0) {
    segments_00.size_ = in_RCX;
    writePackedMessage((capnp *)this.ptr,(BufferedOutputStream *)segments.ptr,segments_00);
    return;
  }
  buffer_00.size_ = 0x2000;
  buffer_00.ptr = local_2028;
  sVar1 = 0x2000;
  kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper(&local_2070,output,buffer_00);
  segments_01.size_ = sVar1;
  segments_01.ptr = segments_00.ptr;
  writePackedMessage((capnp *)&local_2070,(BufferedOutputStream *)segments.ptr,segments_01);
  kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper(&local_2070);
  return;
}

Assistant:

void writePackedMessage(kj::OutputStream& output,
                        kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_IF_MAYBE(bufferedOutputPtr, kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream>(output)) {
    writePackedMessage(*bufferedOutputPtr, segments);
  } else {
    byte buffer[8192];
    kj::BufferedOutputStreamWrapper bufferedOutput(output, kj::arrayPtr(buffer, sizeof(buffer)));
    writePackedMessage(bufferedOutput, segments);
  }